

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_fexp2_df_mipsel
               (CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  int n;
  long lVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  float32 fVar10;
  float64 fVar11;
  long lVar12;
  uint uVar13;
  float64 *pfVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  lVar5 = (ulong)ws * 0x10 + 0x228;
  lVar6 = (ulong)wt * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar12 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      n = *(int *)((long)(env->active_fpu).fpr + lVar12 * 4 + lVar6 + -0x228);
      if (n < -0x1ff) {
        n = -0x200;
      }
      if (0x1ff < n) {
        n = 0x200;
      }
      fVar10 = float32_scalbn_mipsel
                         (*(float32 *)((long)(env->active_fpu).fpr + lVar12 * 4 + lVar5 + -0x228),n,
                          pfVar2);
      *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar10;
      if ((fVar10 & 0x7fffffff) == 0) {
        uVar18 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar18 = (uint)bVar4;
        if ((fVar10 & 0x7f800000) == 0) {
          uVar18 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mipsel(uVar18);
      uVar13 = (env->active_tc).msacsr;
      uVar17 = (uVar13 & 0x1000000) >> 0x18 & uVar18 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar17;
      }
      if (uVar18 < 0x80) {
        uVar15 = uVar17;
      }
      uVar15 = uVar15 | uVar8;
      uVar17 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar17 | uVar15;
      uVar18 = uVar8 & 0xfffffffc;
      if ((uVar17 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar18 = uVar9;
      }
      if ((uVar15 & 2) == 0) {
        uVar18 = uVar9;
      }
      if ((uVar18 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar18 << 0xc;
LAB_00813204:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar18) != 0) goto LAB_0081321f;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar15 = uVar18 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_00813204;
        }
LAB_0081321f:
        fVar10 = float32_default_nan_mipsel(pfVar2);
        *(float32 *)((long)afStack_40 + lVar12 * 4 + -8) = fVar10 & 0xffffffc0 ^ 0x400000 | uVar18;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1986,
                    "void helper_msa_fexp2_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    pfVar14 = &local_48;
    lVar12 = 0;
    bVar7 = true;
    do {
      bVar19 = bVar7;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      lVar16 = *(long *)((long)(env->active_fpu).fpr + lVar12 * 8 + lVar6 + -0x228);
      if (lVar16 < -0xfff) {
        lVar16 = -0x1000;
      }
      if (0xfff < lVar16) {
        lVar16 = 0x1000;
      }
      fVar11 = float64_scalbn_mipsel
                         (*(float64 *)((long)(env->active_fpu).fpr + lVar12 * 8 + lVar5 + -0x228),
                          (int)lVar16,pfVar2);
      *pfVar14 = fVar11;
      if ((fVar11 & 0x7fffffffffffffff) == 0) {
        uVar18 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar18 = (uint)bVar4;
        if ((fVar11 & 0x7ff0000000000000) == 0) {
          uVar18 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mipsel(uVar18);
      uVar13 = (env->active_tc).msacsr;
      uVar17 = (uVar13 & 0x1000000) >> 0x18 & uVar18 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar17;
      }
      if (uVar18 < 0x80) {
        uVar15 = uVar17;
      }
      uVar15 = uVar15 | uVar8;
      uVar17 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar17 | uVar15;
      uVar18 = uVar8 & 0xfffffffc;
      if ((uVar17 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar18 = uVar9;
      }
      if ((uVar15 & 2) == 0) {
        uVar18 = uVar9;
      }
      if ((uVar18 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar15 = uVar18 << 0xc;
LAB_008130a0:
        (env->active_tc).msacsr = uVar15 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar18) != 0) goto LAB_008130bb;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar15 = uVar18 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_008130a0;
        }
LAB_008130bb:
        fVar11 = float64_default_nan_mipsel(pfVar2);
        *pfVar14 = (long)(int)uVar18 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar12 = 1;
      pfVar14 = afStack_40;
      bVar7 = false;
    } while (bVar19);
  }
  uVar18 = (env->active_tc).msacsr;
  uVar13 = uVar18 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar18 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
  }
  (env->active_tc).msacsr = (uVar18 >> 0xc & 0x1f) << 2 | uVar18;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48;
  (&pfVar3->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_fexp2_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_BINOP(pwx->w[i], scalbn, pws->w[i],
                            pwt->w[i] >  0x200 ?  0x200 :
                            pwt->w[i] < -0x200 ? -0x200 : pwt->w[i],
                            32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_BINOP(pwx->d[i], scalbn, pws->d[i],
                            pwt->d[i] >  0x1000 ?  0x1000 :
                            pwt->d[i] < -0x1000 ? -0x1000 : pwt->d[i],
                            64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}